

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_2,_3>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_2,_3>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_> *dst)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  vector<float,_std::allocator<float>_> scalars;
  vector<float,_std::allocator<float>_> local_58;
  float local_38 [8];
  
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_58);
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = 0;
    do {
      local_38[0] = 0.0;
      local_38[1] = 0.0;
      local_38[2] = 0.0;
      local_38[3] = 0.0;
      local_38[4] = 0.0;
      local_38[5] = 0.0;
      pfVar1 = local_38;
      lVar2 = 0;
      do {
        lVar3 = 0;
        do {
          if (lVar2 == lVar3) {
            fVar6 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4];
          }
          else {
            fVar6 = 0.0;
          }
          pfVar1[lVar3 * 2] = fVar6;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        pfVar1 = pfVar1 + 1;
        bVar5 = lVar2 == 0;
        lVar2 = lVar2 + 1;
      } while (bVar5);
      std::vector<tcu::Matrix<float,2,3>,std::allocator<tcu::Matrix<float,2,3>>>::
      emplace_back<tcu::Matrix<float,2,3>>
                ((vector<tcu::Matrix<float,2,3>,std::allocator<tcu::Matrix<float,2,3>>> *)dst,
                 (Matrix<float,_2,_3> *)local_38);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}